

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampTest::verifyTextureGatherCmpResult
          (TextureBorderClampTest *this,ConstPixelBufferAccess *renderedFrame,float *texCoordArray,
          ReferenceParams *samplerParams,TexComparePrecision *texComparePrecision,
          TexComparePrecision *lowQualityTexComparePrecision)

{
  size_t *this_00;
  Vec2 prec;
  bool bVar1;
  int iVar2;
  int iVar3;
  Texture2D *this_01;
  Texture2D *this_02;
  RenderTarget *this_03;
  PixelFormat *pPVar4;
  IVec2 (*paIVar5) [4];
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  float fVar8;
  float fVar9;
  float t;
  Texture2DView TVar10;
  allocator<char> local_7f1;
  string local_7f0;
  allocator<char> local_7c9;
  string local_7c8;
  LogImage local_7a8;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  LogImage local_6c8;
  allocator<char> local_631;
  string local_630;
  allocator<char> local_609;
  string local_608;
  LogImage local_5e8;
  allocator<char> local_551;
  string local_550;
  allocator<char> local_529;
  string local_528;
  LogImageSet local_508;
  allocator<char> local_4c1;
  string local_4c0;
  MessageBuilder local_4a0;
  MessageBuilder local_320;
  deUint32 local_1a0;
  Vector<bool,_4> local_19c;
  Vector<bool,_4> local_198;
  deUint32 local_194;
  undefined1 local_190 [8];
  Vec4 resultValue;
  Vec4 referenceValue;
  float refZ;
  Vec2 texCoord;
  Vector<float,_2> local_15c;
  Vector<float,_2> local_154;
  Vector<float,_2> local_14c;
  Vector<float,_2> local_144;
  Vec2 viewportCoord;
  int px;
  int py;
  PixelBufferAccess local_120;
  byte local_f5;
  int local_f4;
  undefined1 local_f0 [3];
  bool lowQuality;
  int numFailedPixels;
  Surface errorMask;
  Surface reference;
  undefined1 auStack_b8 [3];
  deUint8 fbColormask;
  BVec4 colorMask;
  PixelFormat pixelFormat;
  Texture2DView local_90;
  undefined1 local_80 [8];
  Texture2DView effectiveView;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Vec2 texCoords [4];
  TexComparePrecision *lowQualityTexComparePrecision_local;
  TexComparePrecision *texComparePrecision_local;
  ReferenceParams *samplerParams_local;
  float *texCoordArray_local;
  ConstPixelBufferAccess *renderedFrame_local;
  TextureBorderClampTest *this_local;
  
  texCoords[3].m_data = (float  [2])lowQualityTexComparePrecision;
  tcu::Vector<float,_2>::Vector
            ((Vector<float,_2> *)
             &srcLevelStorage.
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,*texCoordArray,texCoordArray[1]);
  tcu::Vector<float,_2>::Vector(texCoords,texCoordArray[2],texCoordArray[3]);
  tcu::Vector<float,_2>::Vector(texCoords + 1,texCoordArray[4],texCoordArray[5]);
  tcu::Vector<float,_2>::Vector(texCoords + 2,texCoordArray[6],texCoordArray[7]);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &effectiveView.m_levels);
  this_01 = de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::operator->
                      (&(this->m_texture).
                        super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>);
  this_02 = glu::Texture2D::getRefTexture(this_01);
  TVar10 = tcu::Texture2D::operator_cast_to_Texture2DView(this_02);
  local_90.m_levels = TVar10.m_levels;
  local_90.m_numLevels = TVar10.m_numLevels;
  TVar10 = tcu::getEffectiveTextureView
                     (&local_90,
                      (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                       *)&effectiveView.m_levels,&samplerParams->sampler);
  effectiveView._0_8_ = TVar10.m_levels;
  local_80._0_4_ = TVar10.m_numLevels;
  this_03 = Context::getRenderTarget((this->super_TestCase).m_context);
  pPVar4 = tcu::RenderTarget::getPixelFormat(this_03);
  _auStack_b8 = pPVar4->redBits;
  unique0x10000863 = pPVar4->greenBits;
  glu::TextureTestUtil::getCompareMask
            ((TextureTestUtil *)((long)&reference.m_pixels.m_cap + 4),(PixelFormat *)auStack_b8);
  reference.m_pixels.m_cap._3_1_ = tcu::getColorMask((PixelFormat *)auStack_b8);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(renderedFrame);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,iVar2,iVar3);
  iVar2 = tcu::ConstPixelBufferAccess::getWidth(renderedFrame);
  iVar3 = tcu::ConstPixelBufferAccess::getHeight(renderedFrame);
  tcu::Surface::Surface((Surface *)local_f0,iVar2,iVar3);
  local_f4 = 0;
  local_f5 = 0;
  tcu::Surface::getAccess(&local_120,(Surface *)local_f0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(&local_120,(Vec4 *)&py);
  for (viewportCoord.m_data[1] = 0.0; fVar8 = viewportCoord.m_data[1],
      iVar2 = tcu::Surface::getHeight((Surface *)&errorMask.m_pixels.m_cap), (int)fVar8 < iVar2;
      viewportCoord.m_data[1] = (float)((int)viewportCoord.m_data[1] + 1)) {
    for (viewportCoord.m_data[0] = 0.0; fVar8 = viewportCoord.m_data[0],
        iVar2 = tcu::Surface::getWidth((Surface *)&errorMask.m_pixels.m_cap), (int)fVar8 < iVar2;
        viewportCoord.m_data[0] = (float)((int)viewportCoord.m_data[0] + 1)) {
      tcu::Vector<float,_2>::Vector
                (&local_154,(float)(int)viewportCoord.m_data[0],(float)(int)viewportCoord.m_data[1])
      ;
      tcu::Vector<float,_2>::Vector(&local_15c,0.5);
      tcu::operator+((tcu *)&local_14c,&local_154,&local_15c);
      this_00 = &errorMask.m_pixels.m_cap;
      iVar2 = tcu::Surface::getWidth((Surface *)this_00);
      iVar3 = tcu::Surface::getHeight((Surface *)this_00);
      tcu::Vector<float,_2>::Vector(&texCoord,(float)iVar2,(float)iVar3);
      tcu::operator/((tcu *)&local_144,&local_14c,&texCoord);
      fVar8 = tcu::Vector<float,_2>::x(&local_144);
      fVar9 = tcu::Vector<float,_2>::y(&local_144);
      (anonymous_namespace)::triQuadInterpolate<tcu::Vector<float,2>>
                ((_anonymous_namespace_ *)(referenceValue.m_data + 3),
                 (Vector<float,_2> (*) [4])
                 &srcLevelStorage.
                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,fVar8,fVar9);
      fVar8 = (samplerParams->super_RenderParams).ref;
      referenceValue.m_data[2] = fVar8;
      fVar9 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(referenceValue.m_data + 3));
      t = tcu::Vector<float,_2>::y((Vector<float,_2> *)(referenceValue.m_data + 3));
      glu::getDefaultGatherOffsets();
      tcu::Texture2DView::gatherOffsetsCompare
                ((Texture2DView *)(resultValue.m_data + 2),(Sampler *)local_80,fVar8,fVar9,t,
                 (IVec2 (*) [4])&samplerParams->sampler);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_190,(int)renderedFrame,(int)viewportCoord.m_data[0]
                 ,(int)viewportCoord.m_data[1]);
      fVar9 = viewportCoord.m_data[1];
      fVar8 = viewportCoord.m_data[0];
      local_194 = (deUint32)
                  tcu::toRGBAMasked((Vec4 *)(resultValue.m_data + 2),reference.m_pixels.m_cap._3_1_)
      ;
      tcu::Surface::setPixel
                ((Surface *)&errorMask.m_pixels.m_cap,(int)fVar8,(int)fVar9,(RGBA)local_194);
      tcu::notEqual<float,4>
                ((tcu *)&local_19c,(Vector<float,_4> *)(resultValue.m_data + 2),
                 (Vector<float,_4> *)local_190);
      tcu::logicalAnd<bool,4>
                ((tcu *)&local_198,(Vector<bool,_4> *)((long)&reference.m_pixels.m_cap + 4),
                 &local_19c);
      bVar1 = tcu::boolAny<4>(&local_198);
      if (bVar1) {
        paIVar5 = glu::getDefaultGatherOffsets();
        bVar1 = tcu::isGatherOffsetsCompareResultValid
                          ((Texture2DView *)local_80,&samplerParams->sampler,texComparePrecision,
                           (Vec2 *)(referenceValue.m_data + 3),paIVar5,referenceValue.m_data[2],
                           (Vec4 *)local_190);
        prec = texCoords[3];
        if (!bVar1) {
          local_f5 = 1;
          paIVar5 = glu::getDefaultGatherOffsets();
          bVar1 = tcu::isGatherOffsetsCompareResultValid
                            ((Texture2DView *)local_80,&samplerParams->sampler,
                             (TexComparePrecision *)prec.m_data,(Vec2 *)(referenceValue.m_data + 3),
                             paIVar5,referenceValue.m_data[2],(Vec4 *)local_190);
          fVar9 = viewportCoord.m_data[1];
          fVar8 = viewportCoord.m_data[0];
          if (!bVar1) {
            local_1a0 = (deUint32)tcu::RGBA::red();
            tcu::Surface::setPixel((Surface *)local_f0,(int)fVar8,(int)fVar9,(RGBA)local_1a0);
            local_f4 = local_f4 + 1;
          }
        }
      }
    }
  }
  if (local_f4 < 1) {
    if ((local_f5 & 1) != 0) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<
                         (&local_4a0,
                          (char (*) [66])
                          "Warning: Verification assuming high-quality PCF filtering failed.");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"Low-quality result",&local_4c1);
      tcu::ResultCollector::addResult(&this->m_result,QP_TEST_RESULT_QUALITY_WARNING,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
    }
  }
  else {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (&local_320,(char (*) [40])"ERROR: Result verification failed, got ");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_f4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
  }
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"VerifyResult",&local_529)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"Verification result",&local_551);
  tcu::LogImageSet::LogImageSet(&local_508,&local_528,&local_550);
  pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"Rendered",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"Rendered image",&local_631);
  tcu::LogImage::LogImage
            (&local_5e8,&local_608,&local_630,renderedFrame,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar6,&local_5e8);
  tcu::LogImage::~LogImage(&local_5e8);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  tcu::LogImageSet::~LogImageSet(&local_508);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  if (0 < local_f4) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"Reference",&local_6e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"Ideal reference image",&local_711);
    tcu::LogImage::LogImage
              (&local_6c8,&local_6e8,&local_710,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_6c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7c8,"ErrorMask",&local_7c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"Error mask",&local_7f1)
    ;
    tcu::LogImage::LogImage
              (&local_7a8,&local_7c8,&local_7f0,(Surface *)local_f0,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar6,&local_7a8);
    tcu::LogImage::~LogImage(&local_7a8);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator(&local_7c9);
    tcu::LogImage::~LogImage(&local_6c8);
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator(&local_6e9);
  }
  pTVar6 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  bVar1 = local_f4 == 0;
  tcu::Surface::~Surface((Surface *)local_f0);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &effectiveView.m_levels);
  return bVar1;
}

Assistant:

bool TextureBorderClampTest::verifyTextureGatherCmpResult (const tcu::ConstPixelBufferAccess&			renderedFrame,
														   const float*									texCoordArray,
														   const glu::TextureTestUtil::ReferenceParams&	samplerParams,
														   const tcu::TexComparePrecision&				texComparePrecision,
														   const tcu::TexComparePrecision&				lowQualityTexComparePrecision)
{
	const tcu::Vec2 texCoords[4] =
	{
		tcu::Vec2(texCoordArray[0], texCoordArray[1]),
		tcu::Vec2(texCoordArray[2], texCoordArray[3]),
		tcu::Vec2(texCoordArray[4], texCoordArray[5]),
		tcu::Vec2(texCoordArray[6], texCoordArray[7]),
	};

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture2DView					effectiveView		= tcu::getEffectiveTextureView(m_texture->getRefTexture(), srcLevelStorage, samplerParams.sampler);

	const tcu::PixelFormat						pixelFormat			= m_context.getRenderTarget().getPixelFormat();
	const tcu::BVec4							colorMask			= glu::TextureTestUtil::getCompareMask(pixelFormat);
	const deUint8								fbColormask			= tcu::getColorMask(pixelFormat);
	tcu::Surface								reference			(renderedFrame.getWidth(), renderedFrame.getHeight());
	tcu::Surface								errorMask			(renderedFrame.getWidth(), renderedFrame.getHeight());
	int											numFailedPixels		= 0;
	bool										lowQuality			= false;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toVec());

	for (int py = 0; py < reference.getHeight(); ++py)
	for (int px = 0; px < reference.getWidth(); ++px)
	{
		const tcu::Vec2			viewportCoord	= (tcu::Vec2((float)px, (float)py) + tcu::Vec2(0.5f)) / tcu::Vec2((float)reference.getWidth(), (float)reference.getHeight());
		const tcu::Vec2			texCoord		= triQuadInterpolate(texCoords, viewportCoord.x(), viewportCoord.y());
		const float				refZ			= samplerParams.ref;
		const tcu::Vec4			referenceValue	= effectiveView.gatherOffsetsCompare(samplerParams.sampler, refZ, texCoord.x(), texCoord.y(), glu::getDefaultGatherOffsets());
		const tcu::Vec4			resultValue		= renderedFrame.getPixel(px, py);

		reference.setPixel(px, py, tcu::toRGBAMasked(referenceValue, fbColormask));

		if (tcu::boolAny(tcu::logicalAnd(colorMask, tcu::notEqual(referenceValue, resultValue))))
		{
			if (!tcu::isGatherOffsetsCompareResultValid(effectiveView, samplerParams.sampler, texComparePrecision, texCoord, glu::getDefaultGatherOffsets(), refZ, resultValue))
			{
				lowQuality = true;

				// fall back to low quality verification
				if (!tcu::isGatherOffsetsCompareResultValid(effectiveView, samplerParams.sampler, lowQualityTexComparePrecision, texCoord, glu::getDefaultGatherOffsets(), refZ, resultValue))
				{
					errorMask.setPixel(px, py, tcu::RGBA::red());
					++numFailedPixels;
				}
			}
		}
	}

	if (numFailedPixels > 0)
		m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Result verification failed, got " << numFailedPixels << " invalid pixels!" << tcu::TestLog::EndMessage;
	else if (lowQuality)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Warning: Verification assuming high-quality PCF filtering failed." << tcu::TestLog::EndMessage;
		m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Low-quality result");
	}

	m_testCtx.getLog()	<< tcu::TestLog::ImageSet("VerifyResult", "Verification result")
						<< tcu::TestLog::Image("Rendered", "Rendered image", renderedFrame);
	if (numFailedPixels > 0)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Image("Reference", "Ideal reference image", reference)
							<< tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);
	}
	m_testCtx.getLog() << tcu::TestLog::EndImageSet;

	return (numFailedPixels == 0);
}